

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

int Scl_LibertyReadTimeUnit(Scl_Tree_t *p)

{
  uint uVar1;
  Scl_Item_t *pSVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  Scl_Item_t *pSVar7;
  bool bVar8;
  
  pSVar2 = p->pItems;
  uVar1 = pSVar2->Child;
  iVar5 = p->nItems;
  if (iVar5 <= (int)uVar1) {
LAB_003d06b7:
    __assert_fail("v < p->nItems",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                  ,0x4c,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
  }
  if (pSVar2 != (Scl_Item_t *)0x0 && -1 < (int)uVar1) {
    pSVar7 = pSVar2 + uVar1;
    pcVar6 = p->pContents;
    do {
      iVar4 = (pSVar7->Key).Beg;
      iVar3 = (pSVar7->Key).End - iVar4;
      iVar4 = strncmp(pcVar6 + iVar4,"time_unit",(long)iVar3);
      if (iVar3 == 9 && iVar4 == 0) {
        pcVar6 = Scl_LibertyReadString(p,pSVar7->Head);
        iVar5 = strcmp(pcVar6,"1ns");
        if (iVar5 == 0) {
          iVar5 = 9;
LAB_003d0691:
          bVar8 = false;
        }
        else {
          iVar5 = strcmp(pcVar6,"100ps");
          if (iVar5 == 0) {
            iVar5 = 10;
            goto LAB_003d0691;
          }
          iVar5 = strcmp(pcVar6,"10ps");
          if (iVar5 == 0) {
            iVar5 = 0xb;
            goto LAB_003d0691;
          }
          iVar5 = strcmp(pcVar6,"1ps");
          bVar8 = iVar5 != 0;
          iVar5 = 0xc;
        }
        if (!bVar8) {
          return iVar5;
        }
        break;
      }
      uVar1 = pSVar7->Next;
      if (iVar5 <= (int)uVar1) goto LAB_003d06b7;
      pSVar7 = pSVar2 + uVar1;
      if ((int)uVar1 < 0) {
        pSVar7 = (Scl_Item_t *)0x0;
      }
    } while (pSVar7 != (Scl_Item_t *)0x0);
  }
  puts("Libery parser cannot read \"time_unit\".  Assuming   time_unit : \"1ns\".");
  return 9;
}

Assistant:

int Scl_LibertyReadTimeUnit( Scl_Tree_t * p )
{
    Scl_Item_t * pItem;
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pItem, "time_unit" )
    {
        char * pUnit = Scl_LibertyReadString(p, pItem->Head);
        // 9=1ns, 10=100ps, 11=10ps, 12=1ps
        if ( !strcmp(pUnit, "1ns") )
            return 9;
        if ( !strcmp(pUnit, "100ps") )
            return 10;
        if ( !strcmp(pUnit, "10ps") )
            return 11;
        if ( !strcmp(pUnit, "1ps") )
            return 12;
        break;
    }
    printf( "Libery parser cannot read \"time_unit\".  Assuming   time_unit : \"1ns\".\n" );
    return 9;
}